

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffgsdt(int *day,int *month,int *year,int *status)

{
  tm *local_38;
  tm *date;
  time_t now;
  int *status_local;
  int *year_local;
  int *month_local;
  int *day_local;
  
  now = (time_t)status;
  status_local = year;
  year_local = month;
  month_local = day;
  date = (tm *)time((time_t *)0x0);
  local_38 = gmtime((time_t *)&date);
  if (local_38 == (tm *)0x0) {
    local_38 = localtime((time_t *)&date);
  }
  *month_local = local_38->tm_mday;
  *year_local = local_38->tm_mon + 1;
  *status_local = local_38->tm_year + 0x76c;
  return *(int *)now;
}

Assistant:

int ffgsdt( int *day, int *month, int *year, int *status )
{  
/*
      This routine is included for backward compatibility
            with the Fortran FITSIO library.

   ffgsdt : Get current System DaTe (GMT if available)

      Return integer values of the day, month, and year

         Function parameters:
            day      Day of the month
            month    Numerical month (1=Jan, etc.)
            year     Year (1999, 2000, etc.)
            status   output error status

*/
   time_t now;
   struct tm *date;

   now = time( NULL );
   date = gmtime(&now);         /* get GMT (= UTC) time */

   if (!date)                  /* GMT not available on this machine */
   {
       date = localtime(&now); 
   }

   *day = date->tm_mday;
   *month = date->tm_mon + 1;
   *year = date->tm_year + 1900;  /* tm_year is defined as years since 1900 */
   return( *status );
}